

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParsePHPCoverage.cxx
# Opt level: O0

bool __thiscall cmParsePHPCoverage::ReadPHPCoverageDirectory(cmParsePHPCoverage *this,char *d)

{
  Directory __s;
  bool bVar1;
  unsigned_long uVar2;
  char *pcVar3;
  cmAlphaNum local_120;
  cmAlphaNum local_f0;
  undefined1 local_c0 [8];
  string path;
  undefined1 local_98 [8];
  string file;
  uint i;
  size_t numf;
  allocator<char> local_51;
  string local_50;
  Status local_30;
  Directory local_28;
  Directory dir;
  char *d_local;
  cmParsePHPCoverage *this_local;
  
  dir.Internal = (DirectoryInternals *)d;
  cmsys::Directory::Directory(&local_28);
  __s.Internal = dir.Internal;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,(char *)__s.Internal,&local_51);
  local_30 = cmsys::Directory::Load(&local_28,&local_50,(string *)0x0);
  bVar1 = cmsys::Status::operator_cast_to_bool(&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    uVar2 = cmsys::Directory::GetNumberOfFiles(&local_28);
    for (file.field_2._12_4_ = 0; (uint)file.field_2._12_4_ < uVar2;
        file.field_2._12_4_ = file.field_2._12_4_ + 1) {
      pcVar3 = cmsys::Directory::GetFile(&local_28,(ulong)(uint)file.field_2._12_4_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_98,pcVar3,(allocator<char> *)(path.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(path.field_2._M_local_buf + 0xf));
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_98,".");
      if (((!bVar1) ||
          (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_98,".."), !bVar1)) ||
         (bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_98), bVar1)) {
LAB_001dc961:
        bVar1 = false;
      }
      else {
        cmAlphaNum::cmAlphaNum(&local_f0,(char *)dir.Internal);
        cmAlphaNum::cmAlphaNum(&local_120,'/');
        cmStrCat<std::__cxx11::string>
                  ((string *)local_c0,&local_f0,&local_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        bVar1 = ReadPHPData(this,pcVar3);
        if (!bVar1) {
          this_local._7_1_ = 0;
        }
        bVar1 = !bVar1;
        std::__cxx11::string::~string((string *)local_c0);
        if (!bVar1) goto LAB_001dc961;
      }
      std::__cxx11::string::~string((string *)local_98);
      if (bVar1) goto LAB_001dc9a6;
    }
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_001dc9a6:
  cmsys::Directory::~Directory(&local_28);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmParsePHPCoverage::ReadPHPCoverageDirectory(const char* d)
{
  cmsys::Directory dir;
  if (!dir.Load(d)) {
    return false;
  }
  size_t numf;
  unsigned int i;
  numf = dir.GetNumberOfFiles();
  for (i = 0; i < numf; i++) {
    std::string file = dir.GetFile(i);
    if (file != "." && file != ".." && !cmSystemTools::FileIsDirectory(file)) {
      std::string path = cmStrCat(d, '/', file);
      if (!this->ReadPHPData(path.c_str())) {
        return false;
      }
    }
  }
  return true;
}